

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::base_widget::base_widget(base_widget *this)

{
  noncopyable *in_RDI;
  basic_message<char> *in_stack_ffffffffffffffb0;
  
  base_form::base_form((base_form *)in_RDI);
  booster::noncopyable::noncopyable(in_RDI);
  *(undefined ***)in_RDI = &PTR_render_0052c4b8;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x28));
  booster::locale::basic_message<char>::basic_message(in_stack_ffffffffffffffb0);
  booster::locale::basic_message<char>::basic_message(in_stack_ffffffffffffffb0);
  booster::locale::basic_message<char>::basic_message(in_stack_ffffffffffffffb0);
  std::__cxx11::string::string((string *)(in_RDI + 0x1c8));
  *(undefined8 *)(in_RDI + 0x1e8) = 0;
  in_RDI[0x1f0] = (noncopyable)((byte)in_RDI[0x1f0] | 1);
  in_RDI[0x1f0] = (noncopyable)((byte)in_RDI[0x1f0] & 0xfd);
  in_RDI[0x1f0] = (noncopyable)((byte)in_RDI[0x1f0] & 0xfb);
  in_RDI[0x1f0] = (noncopyable)((byte)in_RDI[0x1f0] & 0xf7);
  in_RDI[0x1f0] = (noncopyable)((byte)in_RDI[0x1f0] & 0xef);
  in_RDI[0x1f0] = (noncopyable)((byte)in_RDI[0x1f0] & 0xdf);
  in_RDI[0x1f0] = (noncopyable)((byte)in_RDI[0x1f0] & 0xbf);
  in_RDI[0x1f0] = (noncopyable)((byte)in_RDI[0x1f0] & 0x7f);
  booster::hold_ptr<cppcms::widgets::base_widget::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::base_widget::_data> *)(in_RDI + 0x1f8));
  return;
}

Assistant:

base_widget::base_widget() : 
	parent_(0),
	is_valid_(1),
	is_set_(0),
	is_disabled_(0),
	is_readonly_(0),
	is_generation_done_(0),
	has_message_(0),
	has_error_(0),
	has_help_(0)
{
}